

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O0

void __thiscall
flatbuffers::FlatBufferBuilder::FlatBufferBuilder(FlatBufferBuilder *this,uoffset_t initial_size)

{
  uoffset_t initial_size_local;
  FlatBufferBuilder *this_local;
  
  vector_downward::vector_downward(&this->buf_,(ulong)initial_size);
  std::
  vector<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
  ::vector(&this->offsetbuf_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->vtables_);
  this->minalign_ = 1;
  this->force_defaults_ = false;
  std::
  vector<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
  ::reserve(&this->offsetbuf_,0x10);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this->vtables_,0x10);
  EndianCheck();
  this->flatbuffer_version_string = "FlatBuffers 1.0.0";
  return;
}

Assistant:

explicit FlatBufferBuilder(uoffset_t initial_size = 1024)
    : buf_(initial_size), minalign_(1), force_defaults_(false) {
    offsetbuf_.reserve(16);  // Avoid first few reallocs.
    vtables_.reserve(16);
    EndianCheck();
    flatbuffer_version_string =
      "FlatBuffers "
      FLATBUFFERS_STRING(FLATBUFFERS_VERSION_MAJOR) "."
      FLATBUFFERS_STRING(FLATBUFFERS_VERSION_MINOR) "."
      FLATBUFFERS_STRING(FLATBUFFERS_VERSION_REVISION);
  }